

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

void __thiscall Quat4f::invert(Quat4f *this)

{
  float fVar1;
  Quat4f local_30;
  undefined1 local_20 [8];
  Quat4f inverse;
  Quat4f *this_local;
  
  inverse.m_elements._8_8_ = this;
  conjugated(&local_30);
  fVar1 = absSquared(this);
  ::operator*((Quat4f *)local_20,1.0 / fVar1);
  this->m_elements[0] = (float)local_20._0_4_;
  this->m_elements[1] = (float)local_20._4_4_;
  this->m_elements[2] = inverse.m_elements[0];
  this->m_elements[3] = inverse.m_elements[1];
  return;
}

Assistant:

void Quat4f::invert()
{
	Quat4f inverse = conjugated() * ( 1.0f / absSquared() );

	m_elements[ 0 ] = inverse.m_elements[ 0 ];
	m_elements[ 1 ] = inverse.m_elements[ 1 ];
	m_elements[ 2 ] = inverse.m_elements[ 2 ];
	m_elements[ 3 ] = inverse.m_elements[ 3 ];
}